

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_process_active_single_queue
              (event_base *base,evcallback_list *activeq,int max_to_process,timeval *endtime)

{
  uint8_t uVar1;
  short sVar2;
  _func_void_int_short_void_ptr *p_Var3;
  code *pcVar4;
  char *pcVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar6;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar7;
  char *pcVar8;
  undefined1 local_88 [8];
  timeval now;
  _func_void_event_callback_ptr_void_ptr *evcb_cbfinalize;
  int evcb_closure;
  _func_void_event_ptr_void_ptr *evcb_evfinalize;
  _func_void_event_callback_ptr_void_ptr *evcb_selfcb;
  short res;
  _func_void_int_short_void_ptr *evcb_callback;
  event *ev;
  event_callback *peStack_38;
  int count;
  event_callback *evcb;
  timeval *endtime_local;
  int max_to_process_local;
  evcallback_list *activeq_local;
  event_base *base_local;
  
  ev._4_4_ = 0;
  if (activeq == (evcallback_list *)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x66f,"activeq != NULL","event_process_active_single_queue");
  }
  peStack_38 = activeq->tqh_first;
  while( true ) {
    if (peStack_38 == (event_callback *)0x0) {
      return ev._4_4_;
    }
    evcb_callback = (_func_void_int_short_void_ptr *)0x0;
    if ((peStack_38->evcb_flags & 0x80U) == 0) {
      event_queue_remove_active(base,peStack_38);
      pvVar7 = extraout_RDX_02;
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("event_process_active: event_callback %p, closure %d, call %p",peStack_38,
                      (ulong)peStack_38->evcb_closure,(peStack_38->evcb_cb_union).evcb_callback);
        pvVar7 = extraout_RDX_03;
      }
    }
    else {
      evcb_callback = (_func_void_int_short_void_ptr *)event_callback_to_event(peStack_38);
      if (((((event *)evcb_callback)->ev_events & 0x10U) == 0) &&
         (((((event *)evcb_callback)->ev_evcallback).evcb_flags & 0x40U) == 0)) {
        event_del_nolock_((event *)evcb_callback,0);
        pvVar7 = extraout_RDX_00;
      }
      else {
        event_queue_remove_active(base,peStack_38);
        pvVar7 = extraout_RDX;
      }
      if (event_debug_logging_mask_ != 0) {
        pcVar6 = " ";
        if ((((event *)evcb_callback)->ev_res & 2U) != 0) {
          pcVar6 = "EV_READ ";
        }
        pcVar5 = " ";
        if ((((event *)evcb_callback)->ev_res & 4U) != 0) {
          pcVar5 = "EV_WRITE ";
        }
        pcVar8 = " ";
        if ((((event *)evcb_callback)->ev_res & 0x80U) != 0) {
          pcVar8 = "EV_CLOSED ";
        }
        event_debugx_("event_process_active: event: %p, %s%s%scall %p",evcb_callback,pcVar6,pcVar5,
                      pcVar8,(((event *)evcb_callback)->ev_evcallback).evcb_cb_union.evcb_callback);
        pvVar7 = extraout_RDX_01;
      }
    }
    if ((peStack_38->evcb_flags & 0x10U) == 0) {
      ev._4_4_ = ev._4_4_ + 1;
    }
    base->current_event = peStack_38;
    base->current_event_waiters = 0;
    switch(peStack_38->evcb_closure) {
    case '\0':
      if (evcb_callback == (_func_void_int_short_void_ptr *)0x0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x69d,"ev != NULL","event_process_active_single_queue");
      }
      pcVar4 = *(code **)(evcb_callback + 0x18);
      sVar2 = *(short *)(evcb_callback + 0x6a);
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*pcVar4)(*(undefined4 *)(evcb_callback + 0x38),(int)sVar2,
                *(undefined8 *)(evcb_callback + 0x20));
      break;
    case '\x01':
      if (evcb_callback == (_func_void_int_short_void_ptr *)0x0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x693,"ev != NULL","event_process_active_single_queue");
      }
      event_signal_closure(base,(event *)evcb_callback);
      break;
    case '\x02':
      if (evcb_callback == (_func_void_int_short_void_ptr *)0x0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x697,"ev != NULL","event_process_active_single_queue");
      }
      event_persist_closure(base,(event *)evcb_callback);
      break;
    case '\x03':
      p_Var3 = (peStack_38->evcb_cb_union).evcb_callback;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        pvVar7 = extraout_RDX_04;
      }
      (*p_Var3)((int)peStack_38,(short)peStack_38->evcb_arg,pvVar7);
      break;
    case '\x04':
      now.tv_usec = *(__suseconds_t *)&peStack_38->evcb_cb_union;
      base->current_event = (event_callback *)0x0;
      if ((peStack_38->evcb_flags & 0x40U) == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x6bc,"(evcb->evcb_flags & EVLIST_FINALIZING)",
                   "event_process_active_single_queue");
      }
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*(code *)now.tv_usec)();
      break;
    case '\x05':
    case '\x06':
      uVar1 = peStack_38->evcb_closure;
      if (evcb_callback == (_func_void_int_short_void_ptr *)0x0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x6ae,"ev != NULL","event_process_active_single_queue");
      }
      base->current_event = (event_callback *)0x0;
      pcVar4 = *(code **)(evcb_callback + 0x18);
      if ((peStack_38->evcb_flags & 0x40U) == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x6b1,"(evcb->evcb_flags & EVLIST_FINALIZING)",
                   "event_process_active_single_queue");
      }
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*pcVar4)(evcb_callback);
      event_debug_note_teardown_((event *)evcb_callback);
      if (uVar1 == '\x06') {
        event_mm_free_(evcb_callback);
      }
      break;
    default:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0x6c2,"0","event_process_active_single_queue");
    }
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    base->current_event = (event_callback *)0x0;
    if ((base->current_event_waiters != 0) &&
       (base->current_event_waiters = 0, base->current_event_cond != (void *)0x0)) {
      (*evthread_cond_fns_.signal_condition)(base->current_event_cond,1);
    }
    if (base->event_break != 0) {
      return -1;
    }
    if (max_to_process <= ev._4_4_) {
      return ev._4_4_;
    }
    if ((ev._4_4_ != 0) && (endtime != (timeval *)0x0)) {
      update_time_cache(base);
      gettime(base,(timeval *)local_88);
      if (local_88 == (undefined1  [8])endtime->tv_sec) {
        if (endtime->tv_usec <= now.tv_sec) {
          return ev._4_4_;
        }
      }
      else if (endtime->tv_sec <= (long)local_88) {
        return ev._4_4_;
      }
    }
    if (base->event_continue != 0) break;
    peStack_38 = activeq->tqh_first;
  }
  return ev._4_4_;
}

Assistant:

static int
event_process_active_single_queue(struct event_base *base,
    struct evcallback_list *activeq,
    int max_to_process, const struct timeval *endtime)
{
	struct event_callback *evcb;
	int count = 0;

	EVUTIL_ASSERT(activeq != NULL);

	for (evcb = TAILQ_FIRST(activeq); evcb; evcb = TAILQ_FIRST(activeq)) {
		struct event *ev=NULL;
		if (evcb->evcb_flags & EVLIST_INIT) {
			ev = event_callback_to_event(evcb);

			if (ev->ev_events & EV_PERSIST || ev->ev_flags & EVLIST_FINALIZING)
				event_queue_remove_active(base, evcb);
			else
				event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
			event_debug((
			    "event_process_active: event: %p, %s%s%scall %p",
			    ev,
			    ev->ev_res & EV_READ ? "EV_READ " : " ",
			    ev->ev_res & EV_WRITE ? "EV_WRITE " : " ",
			    ev->ev_res & EV_CLOSED ? "EV_CLOSED " : " ",
			    ev->ev_callback));
		} else {
			event_queue_remove_active(base, evcb);
			event_debug(("event_process_active: event_callback %p, "
				"closure %d, call %p",
				evcb, evcb->evcb_closure, evcb->evcb_cb_union.evcb_callback));
		}

		if (!(evcb->evcb_flags & EVLIST_INTERNAL))
			++count;


		base->current_event = evcb;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		base->current_event_waiters = 0;
#endif

		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_SIGNAL:
			EVUTIL_ASSERT(ev != NULL);
			event_signal_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT_PERSIST:
			EVUTIL_ASSERT(ev != NULL);
			event_persist_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT: {
			void (*evcb_callback)(evutil_socket_t, short, void *);
			short res;
			EVUTIL_ASSERT(ev != NULL);
			evcb_callback = *ev->ev_callback;
			res = ev->ev_res;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_callback(ev->ev_fd, res, ev->ev_arg);
		}
		break;
		case EV_CLOSURE_CB_SELF: {
			void (*evcb_selfcb)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_selfcb;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_selfcb(evcb, evcb->evcb_arg);
		}
		break;
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			void (*evcb_evfinalize)(struct event *, void *);
			int evcb_closure = evcb->evcb_closure;
			EVUTIL_ASSERT(ev != NULL);
			base->current_event = NULL;
			evcb_evfinalize = ev->ev_evcallback.evcb_cb_union.evcb_evfinalize;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_evfinalize(ev, ev->ev_arg);
			event_debug_note_teardown_(ev);
			if (evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
		}
		break;
		case EV_CLOSURE_CB_FINALIZE: {
			void (*evcb_cbfinalize)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_cbfinalize;
			base->current_event = NULL;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_cbfinalize(evcb, evcb->evcb_arg);
		}
		break;
		default:
			EVUTIL_ASSERT(0);
		}

		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		base->current_event = NULL;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event_waiters) {
			base->current_event_waiters = 0;
			EVTHREAD_COND_BROADCAST(base->current_event_cond);
		}
#endif

		if (base->event_break)
			return -1;
		if (count >= max_to_process)
			return count;
		if (count && endtime) {
			struct timeval now;
			update_time_cache(base);
			gettime(base, &now);
			if (evutil_timercmp(&now, endtime, >=))
				return count;
		}
		if (base->event_continue)
			break;
	}
	return count;
}